

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  short sVar1;
  int iVar2;
  Arena *pAVar3;
  btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
  *this_00;
  int iVar4;
  string *psVar5;
  string *extraout_RAX;
  Extension *pEVar6;
  MessageLite *this_01;
  string *psVar7;
  string *extraout_RAX_00;
  long lVar8;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  long lVar9;
  undefined1 *puVar10;
  ExtensionSet *this_02;
  ExtensionSet *pEVar11;
  ExtensionSet *pEVar12;
  ulong uVar13;
  ExtensionSet *const_this;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar14;
  int iStack_7c;
  code *pcStack_78;
  ExtensionSet EStack_70;
  ulong uStack_58;
  FieldDescriptor *pFStack_50;
  Extension *pEStack_48;
  ExtensionSet *pEStack_40;
  undefined1 auStack_38 [16];
  
  puVar10 = auStack_38;
  this_02 = (ExtensionSet *)auStack_38;
  if (message == (MessageLite *)0x0) {
    pEStack_40 = (ExtensionSet *)0x13b5a2;
    pEVar6 = FindOrNull(this,number);
    if (pEVar6 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar6);
    return;
  }
  uVar13 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  pEStack_40 = (ExtensionSet *)0x13b544;
  pVar14 = Insert(this,number);
  pEVar6 = pVar14.first;
  pEVar6->descriptor = descriptor;
  if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar6->is_repeated != false) goto LAB_0013b650;
    psVar5 = (string *)0x0;
LAB_0013b5cd:
    if (psVar5 != (string *)0x0) {
      pEStack_40 = (ExtensionSet *)0x13b6a7;
      UnsafeArenaSetAllocatedMessage();
      goto LAB_0013b6a7;
    }
    if ((byte)(pEVar6->type - 0x13) < 0xee) {
      pEStack_40 = (ExtensionSet *)0x13b670;
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
      goto LAB_0013b670;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar6->type * 4) == 10) {
      psVar5 = (string *)0x0;
    }
    else {
      pEStack_40 = (ExtensionSet *)0x13b697;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar6->type * 4),10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (psVar5 == (string *)0x0) {
      if ((pEVar6->field_0xa & 4) != 0) {
        pEStack_40 = (ExtensionSet *)0x13b635;
        (**(code **)(**(long **)&(pEVar6->field_0).int32_t_value + 0x38))
                  (*(long **)&(pEVar6->field_0).int32_t_value,message,this->arena_);
        goto LAB_0013b635;
      }
      if ((this->arena_ == (Arena *)0x0) && ((long *)(pEVar6->field_0).int64_t_value != (long *)0x0)
         ) {
        pEStack_40 = (ExtensionSet *)0x13b621;
        (**(code **)(*(long *)(pEVar6->field_0).int64_t_value + 8))();
      }
      goto LAB_0013b621;
    }
  }
  else {
    pEVar6->type = (FieldType)uVar13;
    if ((byte)(type - 0x13) < 0xee) {
      pEStack_40 = (ExtensionSet *)0x13b650;
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
LAB_0013b650:
      pEStack_40 = (ExtensionSet *)0x13b663;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0013b5cd;
    }
    puVar10 = (undefined1 *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (puVar10 == (undefined1 *)0xa) {
      psVar5 = (string *)0x0;
    }
    else {
LAB_0013b670:
      pEStack_40 = (ExtensionSet *)0x13b681;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)puVar10,10,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (psVar5 == (string *)0x0) {
      pEVar6->is_repeated = false;
      pEVar6->field_0xa = (pEVar6->field_0xa & 0xfa) + 1;
LAB_0013b621:
      pEVar6->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
LAB_0013b635:
      pEVar6->field_0xa = pEVar6->field_0xa & 0xfd;
      return;
    }
LAB_0013b6a7:
    pEStack_40 = (ExtensionSet *)0x13b6b2;
    UnsafeArenaSetAllocatedMessage();
    psVar5 = extraout_RAX;
  }
  pEStack_40 = (ExtensionSet *)0x13b6bd;
  UnsafeArenaSetAllocatedMessage();
  pEVar11 = &EStack_70;
  pEVar12 = &EStack_70;
  pcStack_78 = (code *)0x13b6d8;
  EStack_70.map_ = (AllocatedData)message;
  uStack_58 = uVar13;
  pFStack_50 = descriptor;
  pEStack_48 = pEVar6;
  pEStack_40 = this;
  pEVar6 = FindOrNull(this_02,(int)psVar5);
  if (pEVar6 == (Extension *)0x0) {
    return;
  }
  if (pEVar6->is_repeated == false) {
    psVar7 = (string *)0x0;
  }
  else {
    pcStack_78 = (code *)0x13b7a9;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar7 != (string *)0x0) {
    pcStack_78 = (code *)0x13b7d7;
    ReleaseMessage();
    psVar7 = extraout_RAX_00;
    goto LAB_0013b7d7;
  }
  if ((byte)(pEVar6->type - 0x13) < 0xee) {
    pcStack_78 = (code *)0x13b7b6;
    ReleaseMessage(&EStack_70);
LAB_0013b7b6:
    pcStack_78 = (code *)0x13b7c7;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)pEVar11,10,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
  }
  else {
    pEVar11 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar6->type * 4);
    if (pEVar11 != (ExtensionSet *)0xa) goto LAB_0013b7b6;
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    pAVar3 = this_02->arena_;
    if ((pEVar6->field_0xa & 4) == 0) {
      if (pAVar3 != (Arena *)0x0) {
        pcStack_78 = (code *)0x13b741;
        this_01 = MessageLite::New((MessageLite *)pEVar6->field_0,(Arena *)0x0);
        pcStack_78 = (code *)0x13b74f;
        MessageLite::CheckTypeAndMergeFrom(this_01,(MessageLite *)pEVar6->field_0);
      }
    }
    else {
      pcStack_78 = (code *)0x13b765;
      (**(code **)(**(long **)&(pEVar6->field_0).int32_t_value + 0x40))
                (*(long **)&(pEVar6->field_0).int32_t_value,extraout_RDX,pAVar3);
      if ((pAVar3 == (Arena *)0x0) && ((long *)(pEVar6->field_0).int64_t_value != (long *)0x0)) {
        pcStack_78 = (code *)0x13b77b;
        (**(code **)(*(long *)(pEVar6->field_0).int64_t_value + 8))();
      }
    }
    pcStack_78 = (code *)0x13b785;
    Erase(this_02,(int)psVar5);
    return;
  }
LAB_0013b7d7:
  iVar4 = (int)psVar7;
  pcStack_78 = Erase;
  ReleaseMessage();
  sVar1 = *(short *)((long)pEVar12 + 10);
  this_00 = *(btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              **)((long)pEVar12 + 0x10);
  iStack_7c = iVar4;
  pcStack_78 = (code *)((ulong)psVar5 & 0xffffffff);
  if ((long)sVar1 < 0) {
    absl::lts_20240722::container_internal::
    btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>(this_00,&iStack_7c);
  }
  else if (sVar1 != 0) {
    lVar9 = (long)sVar1 * 0x20;
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)&(this_00->tree_).root_ + lVar8);
      if (iVar2 != iVar4 && iVar4 <= iVar2) {
        return;
      }
      if (iVar2 == iVar4) {
        if (lVar9 + -0x20 != lVar8) {
          memmove((void *)((long)&(this_00->tree_).root_ + lVar8),
                  (void *)((long)&this_00[1].tree_.rightmost_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*,_2UL,_false>
                                  .value + lVar8),(lVar9 - lVar8) - 0x20);
        }
        *(short *)((long)pEVar12 + 10) = *(short *)((long)pEVar12 + 10) + -1;
        return;
      }
      lVar8 = lVar8 + 0x20;
    } while (lVar9 != lVar8);
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = message;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                       arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->ptr.message_value;
      }
      extension->ptr.message_value = message;
    }
  }
  extension->is_cleared = false;
}